

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deflate.c
# Opt level: O1

uLong cm_zlib_deflateBound(z_streamp strm,uLong sourceLen)

{
  Bytef BVar1;
  uint uVar2;
  internal_state *piVar3;
  gz_headerp pgVar4;
  int iVar5;
  ulong uVar6;
  long lVar7;
  uLong uVar8;
  ulong uVar9;
  Bytef *pBVar10;
  ulong uVar11;
  
  lVar7 = (sourceLen + 7 >> 3) + sourceLen;
  uVar11 = sourceLen + 0x3f >> 6;
  iVar5 = deflateStateCheck(strm);
  if (iVar5 == 0) {
    piVar3 = strm->state;
    uVar2 = piVar3->wrap;
    uVar9 = (ulong)uVar2;
    if ((ulong)uVar2 != 0) {
      if (uVar2 == 2) {
        pgVar4 = piVar3->gzhead;
        if (pgVar4 == (gz_headerp)0x0) {
          uVar9 = 0x12;
        }
        else {
          if (pgVar4->extra == (Bytef *)0x0) {
            uVar6 = 0x12;
          }
          else {
            uVar6 = (ulong)(pgVar4->extra_len + 2) + 0x12;
          }
          pBVar10 = pgVar4->name;
          if (pBVar10 != (Bytef *)0x0) {
            do {
              uVar6 = uVar6 + 1;
              BVar1 = *pBVar10;
              pBVar10 = pBVar10 + 1;
            } while (BVar1 != '\0');
          }
          pBVar10 = pgVar4->comment;
          if (pBVar10 != (Bytef *)0x0) {
            do {
              uVar6 = uVar6 + 1;
              BVar1 = *pBVar10;
              pBVar10 = pBVar10 + 1;
            } while (BVar1 != '\0');
          }
          uVar9 = uVar6 + 2;
          if (pgVar4->hcrc == 0) {
            uVar9 = uVar6;
          }
        }
      }
      else if (uVar2 == 1) {
        uVar9 = (ulong)(piVar3->strstart != 0) * 4 + 6;
      }
      else {
        uVar9 = 6;
      }
    }
    if ((piVar3->w_bits == 0xf) && (piVar3->hash_bits == 0xf)) {
      uVar8 = uVar9 + (sourceLen >> 0xc) + sourceLen + (sourceLen >> 0x19) + (sourceLen >> 0xe) + 7;
    }
    else {
      uVar8 = lVar7 + uVar11 + 5 + uVar9;
    }
  }
  else {
    uVar8 = lVar7 + uVar11 + 0xb;
  }
  return uVar8;
}

Assistant:

uLong ZEXPORT deflateBound(strm, sourceLen)
    z_streamp strm;
    uLong sourceLen;
{
    deflate_state *s;
    uLong complen, wraplen;

    /* conservative upper bound for compressed data */
    complen = sourceLen +
              ((sourceLen + 7) >> 3) + ((sourceLen + 63) >> 6) + 5;

    /* if can't get parameters, return conservative bound plus zlib wrapper */
    if (deflateStateCheck(strm))
        return complen + 6;

    /* compute wrapper length */
    s = strm->state;
    switch (s->wrap) {
    case 0:                                 /* raw deflate */
        wraplen = 0;
        break;
    case 1:                                 /* zlib wrapper */
        wraplen = 6 + (s->strstart ? 4 : 0);
        break;
#ifdef GZIP
    case 2:                                 /* gzip wrapper */
        wraplen = 18;
        if (s->gzhead != Z_NULL) {          /* user-supplied gzip header */
            Bytef *str;
            if (s->gzhead->extra != Z_NULL)
                wraplen += 2 + s->gzhead->extra_len;
            str = s->gzhead->name;
            if (str != Z_NULL)
                do {
                    wraplen++;
                } while (*str++);
            str = s->gzhead->comment;
            if (str != Z_NULL)
                do {
                    wraplen++;
                } while (*str++);
            if (s->gzhead->hcrc)
                wraplen += 2;
        }
        break;
#endif
    default:                                /* for compiler happiness */
        wraplen = 6;
    }

    /* if not default parameters, return conservative bound */
    if (s->w_bits != 15 || s->hash_bits != 8 + 7)
        return complen + wraplen;

    /* default settings: return tight bound for that case */
    return sourceLen + (sourceLen >> 12) + (sourceLen >> 14) +
           (sourceLen >> 25) + 13 - 6 + wraplen;
}